

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_db.cpp
# Opt level: O0

void __thiscall Address_Typed_Test::Address_Typed_Test(Address_Typed_Test *this)

{
  Address_Typed_Test *this_local;
  
  anon_unknown.dwarf_297c3::Address::Address(&this->super_Address);
  (this->super_Address).super_Test._vptr_Test = (_func_int **)&PTR__Address_Typed_Test_002eb6f8;
  return;
}

Assistant:

TEST_F (Address, Typed) {
    using ::testing::ElementsAre;
    using namespace ::pstore::dump;

    address::set_expanded (false);
    value_ptr obj = make_value (pstore::typed_address<char>::null ());

    std::ostringstream out;
    obj->write (out);
    EXPECT_EQ (out.str (), "0x0");
}